

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_add_entry_len_l
                  (archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id,char *name,
                  size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_acl_entry *sc_00;
  int *piVar2;
  wchar_t in_ECX;
  wchar_t in_EDX;
  wchar_t in_ESI;
  archive_acl *in_RDI;
  wchar_t in_R8D;
  char *in_R9;
  wchar_t r;
  archive_acl_entry *ap;
  undefined4 local_34;
  undefined4 local_4;
  
  wVar1 = acl_special(in_RDI,in_ESI,in_EDX,in_ECX);
  if (wVar1 == L'\0') {
    local_4 = L'\0';
  }
  else {
    sc_00 = acl_new_entry((archive_acl *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
                          (wchar_t)((ulong)in_R9 >> 0x20),(wchar_t)in_R9);
    if (sc_00 == (archive_acl_entry *)0x0) {
      local_4 = L'\xffffffe7';
    }
    else {
      if (((in_R9 == (char *)0x0) || (*in_R9 == '\0')) || (ap == (archive_acl_entry *)0x0)) {
        local_34 = L'\0';
        archive_mstring_clean((archive_mstring *)0x112b1c);
      }
      else {
        local_34 = archive_mstring_copy_mbs_len_l
                             ((archive_mstring *)CONCAT44(in_ESI,in_EDX),
                              (char *)CONCAT44(in_ECX,in_R8D),(size_t)in_R9,
                              (archive_string_conv *)sc_00);
      }
      if (local_34 == L'\0') {
        local_4 = L'\0';
      }
      else {
        piVar2 = __errno_location();
        if (*piVar2 == 0xc) {
          local_4 = L'\xffffffe2';
        }
        else {
          local_4 = L'\xffffffec';
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
archive_acl_add_entry_len_l(struct archive_acl *acl,
    int type, int permset, int tag, int id, const char *name, size_t len,
    struct archive_string_conv *sc)
{
	struct archive_acl_entry *ap;
	int r;

	if (acl_special(acl, type, permset, tag) == 0)
		return ARCHIVE_OK;
	ap = acl_new_entry(acl, type, permset, tag, id);
	if (ap == NULL) {
		/* XXX Error XXX */
		return ARCHIVE_FAILED;
	}
	if (name != NULL  &&  *name != '\0' && len > 0) {
		r = archive_mstring_copy_mbs_len_l(&ap->name, name, len, sc);
	} else {
		r = 0;
		archive_mstring_clean(&ap->name);
	}
	if (r == 0)
		return (ARCHIVE_OK);
	else if (errno == ENOMEM)
		return (ARCHIVE_FATAL);
	else
		return (ARCHIVE_WARN);
}